

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O3

void __thiscall BBDT<UF>::FirstScan(BBDT<UF> *this)

{
  int iVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint *puVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar5 = (ulong)*(int *)&pMVar2->field_0x8;
  iVar1 = *(int *)&pMVar2->field_0xc;
  lVar6 = (long)iVar1;
  *UF::P_ = 0;
  UF::length_ = 1;
  if (0 < (long)uVar5) {
    uVar15 = 0;
    do {
      if (0 < iVar1) {
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar16 = **(long **)&pMVar2->field_0x48;
        lVar17 = lVar16 * uVar15 + *(long *)&pMVar2->field_0x10;
        lVar18 = lVar17 - lVar16;
        lVar14 = lVar18 - lVar16;
        lVar13 = **(long **)&pMVar3->field_0x48;
        lVar20 = lVar13 * uVar15 + *(long *)&pMVar3->field_0x10;
        lVar16 = lVar16 + lVar17;
        lVar13 = lVar20 + lVar13 * -2;
        uVar19 = uVar15 | 1;
        uVar12 = 0;
        do {
          puVar4 = UF::P_;
          lVar11 = lVar13;
          if (*(char *)(lVar17 + uVar12) == '\0') {
            if ((uVar19 < uVar5) && (*(char *)(lVar16 + uVar12) != '\0')) {
              uVar10 = uVar12 | 1;
              if ((lVar6 <= (long)uVar10) || (*(char *)(lVar17 + uVar10) == '\0')) {
                if ((uVar12 == 0) ||
                   ((*(char *)((uVar12 - 1) + lVar16) == '\0' &&
                    (*(char *)(lVar17 + -1 + uVar12) == '\0')))) goto LAB_00193ed1;
                goto LAB_00194b40;
              }
              if (uVar12 != 0) {
                if (*(char *)((uVar12 - 1) + lVar17) != '\0') {
                  if (uVar15 != 0) {
                    if (*(char *)(lVar18 + uVar10) == '\0') {
                      if (((long)(uVar12 + 2) < lVar6) && (*(char *)(lVar18 + uVar12 + 2) != '\0'))
                      {
                        if (*(char *)(lVar14 + uVar10) == '\0') {
                          uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                          do {
                            uVar8 = uVar9;
                            uVar10 = (ulong)uVar8;
                            uVar9 = UF::P_[uVar10];
                            uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          } while (UF::P_[uVar10] < uVar8);
                          do {
                            uVar9 = uVar7;
                            uVar21 = (ulong)uVar9;
                            uVar7 = UF::P_[uVar21];
                          } while (UF::P_[uVar21] < uVar9);
                        }
                        else {
                          if (*(char *)(lVar18 + uVar12) != '\0') goto LAB_00194b40;
                          if (*(char *)(lVar14 + uVar12) == '\0') {
                            uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                            do {
                              uVar8 = uVar9;
                              uVar10 = (ulong)uVar8;
                              uVar9 = UF::P_[uVar10];
                              uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                            } while (UF::P_[uVar10] < uVar8);
                            do {
                              uVar9 = uVar7;
                              uVar21 = (ulong)uVar9;
                              uVar7 = UF::P_[uVar21];
                            } while (UF::P_[uVar21] < uVar9);
                          }
                          else {
                            if (*(char *)(lVar18 + -1 + uVar12) != '\0') goto LAB_00194b40;
                            if (*(char *)((uVar12 - 2) + lVar18) == '\0') {
                              uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                              do {
                                uVar8 = uVar9;
                                uVar10 = (ulong)uVar8;
                                uVar9 = UF::P_[uVar10];
                                uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                              } while (UF::P_[uVar10] < uVar8);
                              do {
                                uVar9 = uVar7;
                                uVar21 = (ulong)uVar9;
                                uVar7 = UF::P_[uVar21];
                              } while (UF::P_[uVar21] < uVar9);
                            }
                            else {
                              if (*(char *)(lVar14 + -1 + uVar12) != '\0') goto LAB_00194b40;
                              uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                              do {
                                uVar8 = uVar9;
                                uVar10 = (ulong)uVar8;
                                uVar9 = UF::P_[uVar10];
                                uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                              } while (UF::P_[uVar10] < uVar8);
                              do {
                                uVar9 = uVar7;
                                uVar21 = (ulong)uVar9;
                                uVar7 = UF::P_[uVar21];
                              } while (UF::P_[uVar21] < uVar9);
                            }
                          }
                        }
                        goto LAB_00194de8;
                      }
                    }
                    else if (*(char *)(lVar18 + uVar12) == '\0') {
                      if (*(char *)(lVar14 + uVar12) == '\0') {
                        uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar10 = (ulong)uVar8;
                          uVar9 = UF::P_[uVar10];
                          uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                        } while (UF::P_[uVar10] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar21 = (ulong)uVar9;
                          uVar7 = UF::P_[uVar21];
                        } while (UF::P_[uVar21] < uVar9);
                      }
                      else {
                        if (*(char *)(lVar18 + -1 + uVar12) != '\0') goto LAB_00194b40;
                        if (*(char *)((uVar12 - 2) + lVar18) == '\0') {
                          uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                          do {
                            uVar8 = uVar9;
                            uVar10 = (ulong)uVar8;
                            uVar9 = UF::P_[uVar10];
                            uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          } while (UF::P_[uVar10] < uVar8);
                          do {
                            uVar9 = uVar7;
                            uVar21 = (ulong)uVar9;
                            uVar7 = UF::P_[uVar21];
                          } while (UF::P_[uVar21] < uVar9);
                        }
                        else {
                          if (*(char *)(lVar14 + -1 + uVar12) != '\0') goto LAB_00194b40;
                          uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                          do {
                            uVar8 = uVar9;
                            uVar10 = (ulong)uVar8;
                            uVar9 = UF::P_[uVar10];
                            uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          } while (UF::P_[uVar10] < uVar8);
                          do {
                            uVar9 = uVar7;
                            uVar21 = (ulong)uVar9;
                            uVar7 = UF::P_[uVar21];
                          } while (UF::P_[uVar21] < uVar9);
                        }
                      }
                      goto LAB_00194de8;
                    }
                  }
                  goto LAB_00194b40;
                }
                if (*(char *)(lVar16 + -1 + uVar12) != '\0') {
                  if (uVar15 == 0) goto LAB_00194b40;
                  if (*(char *)(lVar18 + uVar10) == '\0') {
                    if (((long)(uVar12 + 2) < lVar6) && (*(char *)(lVar18 + uVar12 + 2) != '\0')) {
                      if (*(char *)(lVar14 + uVar10) == '\0') {
                        if (*(char *)(lVar18 + uVar12) != '\0') {
                          if (*(char *)((uVar12 - 2) + lVar17) == '\0') {
                            uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                            do {
                              uVar8 = uVar9;
                              uVar9 = UF::P_[uVar8];
                              uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                            } while (UF::P_[uVar8] < uVar8);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                            if (uVar8 < uVar9) {
                              UF::P_[uVar9] = uVar8;
                              uVar9 = uVar8;
                            }
                            else {
                              UF::P_[uVar8] = uVar9;
                            }
                            do {
                              uVar7 = uVar9;
                              uVar10 = (ulong)uVar7;
                              uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                              uVar9 = puVar4[uVar10];
                            } while (puVar4[uVar10] < uVar7);
                            do {
                              uVar9 = uVar8;
                              uVar21 = (ulong)uVar9;
                              uVar8 = puVar4[uVar21];
                            } while (puVar4[uVar21] < uVar9);
                          }
                          else {
                            if (*(char *)(lVar18 + -1 + uVar12) != '\0') {
                              uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                              do {
                                uVar8 = uVar9;
                                uVar10 = (ulong)uVar8;
                                uVar9 = UF::P_[uVar10];
                                uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                              } while (UF::P_[uVar10] < uVar8);
                              do {
                                uVar9 = uVar7;
                                uVar21 = (ulong)uVar9;
                                uVar7 = UF::P_[uVar21];
                              } while (UF::P_[uVar21] < uVar9);
                              goto LAB_00194de8;
                            }
                            if (*(char *)(lVar18 + -2 + uVar12) == '\0') {
                              uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                              do {
                                uVar8 = uVar9;
                                uVar9 = UF::P_[uVar8];
                                uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                              } while (UF::P_[uVar8] < uVar8);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                              if (uVar8 < uVar9) {
                                UF::P_[uVar9] = uVar8;
                                uVar9 = uVar8;
                              }
                              else {
                                UF::P_[uVar8] = uVar9;
                              }
                              do {
                                uVar7 = uVar9;
                                uVar10 = (ulong)uVar7;
                                uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                                uVar9 = puVar4[uVar10];
                              } while (puVar4[uVar10] < uVar7);
                              do {
                                uVar9 = uVar8;
                                uVar21 = (ulong)uVar9;
                                uVar8 = puVar4[uVar21];
                              } while (puVar4[uVar21] < uVar9);
                            }
                            else {
                              if (*(char *)(lVar14 + -1 + uVar12) != '\0') {
                                uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                                do {
                                  uVar7 = uVar9;
                                  uVar10 = (ulong)uVar7;
                                  uVar9 = UF::P_[uVar10];
                                  uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                                } while (UF::P_[uVar10] < uVar7);
                                do {
                                  uVar9 = uVar8;
                                  uVar21 = (ulong)uVar9;
                                  uVar8 = UF::P_[uVar21];
                                } while (UF::P_[uVar21] < uVar9);
                                goto LAB_00194374;
                              }
                              uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                              do {
                                uVar8 = uVar9;
                                uVar9 = UF::P_[uVar8];
                                uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                              } while (UF::P_[uVar8] < uVar8);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                              if (uVar8 < uVar9) {
                                UF::P_[uVar9] = uVar8;
                                uVar9 = uVar8;
                              }
                              else {
                                UF::P_[uVar8] = uVar9;
                              }
                              do {
                                uVar7 = uVar9;
                                uVar10 = (ulong)uVar7;
                                uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                                uVar9 = puVar4[uVar10];
                              } while (puVar4[uVar10] < uVar7);
                              do {
                                uVar9 = uVar8;
                                uVar21 = (ulong)uVar9;
                                uVar8 = puVar4[uVar21];
                              } while (puVar4[uVar21] < uVar9);
                            }
                          }
                          goto LAB_00194d99;
                        }
                        uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar10 = (ulong)uVar8;
                          uVar9 = UF::P_[uVar10];
                          uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                        } while (UF::P_[uVar10] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar21 = (ulong)uVar9;
                          uVar7 = UF::P_[uVar21];
                        } while (UF::P_[uVar21] < uVar9);
                      }
                      else if (*(char *)((uVar12 - 2) + lVar17) == '\0') {
                        uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar10 = (ulong)uVar8;
                          uVar9 = UF::P_[uVar10];
                          uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                        } while (UF::P_[uVar10] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar21 = (ulong)uVar9;
                          uVar7 = UF::P_[uVar21];
                        } while (UF::P_[uVar21] < uVar9);
                      }
                      else if (*(char *)(lVar18 + -1 + uVar12) == '\0') {
                        if (*(char *)(lVar18 + -2 + uVar12) == '\0') {
                          uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                          do {
                            uVar8 = uVar9;
                            uVar10 = (ulong)uVar8;
                            uVar9 = UF::P_[uVar10];
                            uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          } while (UF::P_[uVar10] < uVar8);
                          do {
                            uVar9 = uVar7;
                            uVar21 = (ulong)uVar9;
                            uVar7 = UF::P_[uVar21];
                          } while (UF::P_[uVar21] < uVar9);
                        }
                        else if (*(char *)(lVar14 + -1 + uVar12) == '\0') {
                          uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                          do {
                            uVar8 = uVar9;
                            uVar10 = (ulong)uVar8;
                            uVar9 = UF::P_[uVar10];
                            uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          } while (UF::P_[uVar10] < uVar8);
                          do {
                            uVar9 = uVar7;
                            uVar21 = (ulong)uVar9;
                            uVar7 = UF::P_[uVar21];
                          } while (UF::P_[uVar21] < uVar9);
                        }
                        else {
                          if ((*(char *)(lVar18 + uVar12) != '\0') ||
                             (*(char *)(lVar14 + uVar12) != '\0')) goto LAB_00194b40;
                          uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                          do {
                            uVar8 = uVar9;
                            uVar10 = (ulong)uVar8;
                            uVar9 = UF::P_[uVar10];
                            uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          } while (UF::P_[uVar10] < uVar8);
                          do {
                            uVar9 = uVar7;
                            uVar21 = (ulong)uVar9;
                            uVar7 = UF::P_[uVar21];
                          } while (UF::P_[uVar21] < uVar9);
                        }
                      }
                      else {
                        if ((*(char *)(lVar18 + uVar12) != '\0') ||
                           (*(char *)(lVar14 + uVar12) != '\0')) goto LAB_00194b40;
                        uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar10 = (ulong)uVar8;
                          uVar9 = UF::P_[uVar10];
                          uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                        } while (UF::P_[uVar10] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar21 = (ulong)uVar9;
                          uVar7 = UF::P_[uVar21];
                        } while (UF::P_[uVar21] < uVar9);
                      }
                    }
                    else {
                      if (*(char *)(lVar18 + uVar12) == '\0') goto LAB_00194b40;
                      if (*(char *)((uVar12 - 2) + lVar17) == '\0') {
                        uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar10 = (ulong)uVar8;
                          uVar9 = UF::P_[uVar10];
                          uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                        } while (UF::P_[uVar10] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar21 = (ulong)uVar9;
                          uVar7 = UF::P_[uVar21];
                        } while (UF::P_[uVar21] < uVar9);
                      }
                      else {
                        if (*(char *)(lVar18 + -1 + uVar12) != '\0') goto LAB_00194b40;
                        if (*(char *)(lVar18 + -2 + uVar12) == '\0') {
                          uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                          do {
                            uVar8 = uVar9;
                            uVar10 = (ulong)uVar8;
                            uVar9 = UF::P_[uVar10];
                            uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          } while (UF::P_[uVar10] < uVar8);
                          do {
                            uVar9 = uVar7;
                            uVar21 = (ulong)uVar9;
                            uVar7 = UF::P_[uVar21];
                          } while (UF::P_[uVar21] < uVar9);
                        }
                        else {
                          if (*(char *)(lVar14 + -1 + uVar12) != '\0') goto LAB_00194b40;
                          uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                          do {
                            uVar8 = uVar9;
                            uVar10 = (ulong)uVar8;
                            uVar9 = UF::P_[uVar10];
                            uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          } while (UF::P_[uVar10] < uVar8);
                          do {
                            uVar9 = uVar7;
                            uVar21 = (ulong)uVar9;
                            uVar7 = UF::P_[uVar21];
                          } while (UF::P_[uVar21] < uVar9);
                        }
                      }
                    }
                  }
                  else if (*(char *)((uVar12 - 2) + lVar17) == '\0') {
                    uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                  else if (*(char *)(lVar18 + -1 + uVar12) == '\0') {
                    if (*(char *)(lVar18 + -2 + uVar12) == '\0') {
                      uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                      do {
                        uVar8 = uVar9;
                        uVar10 = (ulong)uVar8;
                        uVar9 = UF::P_[uVar10];
                        uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                      } while (UF::P_[uVar10] < uVar8);
                      do {
                        uVar9 = uVar7;
                        uVar21 = (ulong)uVar9;
                        uVar7 = UF::P_[uVar21];
                      } while (UF::P_[uVar21] < uVar9);
                    }
                    else if (*(char *)(lVar14 + -1 + uVar12) == '\0') {
                      uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                      do {
                        uVar8 = uVar9;
                        uVar10 = (ulong)uVar8;
                        uVar9 = UF::P_[uVar10];
                        uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                      } while (UF::P_[uVar10] < uVar8);
                      do {
                        uVar9 = uVar7;
                        uVar21 = (ulong)uVar9;
                        uVar7 = UF::P_[uVar21];
                      } while (UF::P_[uVar21] < uVar9);
                    }
                    else {
                      if ((*(char *)(lVar18 + uVar12) != '\0') ||
                         (*(char *)(lVar14 + uVar12) != '\0')) goto LAB_00194b40;
                      uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                      do {
                        uVar8 = uVar9;
                        uVar10 = (ulong)uVar8;
                        uVar9 = UF::P_[uVar10];
                        uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                      } while (UF::P_[uVar10] < uVar8);
                      do {
                        uVar9 = uVar7;
                        uVar21 = (ulong)uVar9;
                        uVar7 = UF::P_[uVar21];
                      } while (UF::P_[uVar21] < uVar9);
                    }
                  }
                  else {
                    if ((*(char *)(lVar18 + uVar12) != '\0') || (*(char *)(lVar14 + uVar12) != '\0')
                       ) goto LAB_00194b40;
                    uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                  goto LAB_00194de8;
                }
              }
              if (uVar15 == 0) goto LAB_00193ed1;
              if (*(char *)(lVar18 + uVar10) == '\0') {
                if (((long)(uVar12 + 2) < lVar6) && (*(char *)(lVar18 + uVar12 + 2) != '\0')) {
                  if ((*(char *)(lVar18 + uVar12) != '\0') && (*(char *)(lVar14 + uVar10) == '\0'))
                  {
                    uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                    goto LAB_00194de8;
                  }
                  goto LAB_00193f09;
                }
LAB_00193ebd:
                if (*(char *)(lVar18 + uVar12) == '\0') goto LAB_00193ed1;
              }
LAB_00193ec9:
              uVar9 = *(uint *)(lVar11 + uVar12 * 4);
              goto LAB_00194b45;
            }
            uVar10 = uVar12 | 1;
            if ((long)uVar10 < lVar6) {
              if (*(char *)(lVar17 + uVar10) == '\0') {
                if ((uVar5 <= uVar19) || (*(char *)(lVar16 + uVar10) == '\0')) goto LAB_00193c7d;
              }
              else if (uVar15 != 0) {
                if (*(char *)(lVar18 + uVar10) == '\0') {
                  if ((lVar6 <= (long)(uVar12 + 2)) || (*(char *)(lVar18 + uVar12 + 2) == '\0'))
                  goto LAB_00193ebd;
                  if ((*(char *)(lVar18 + uVar12) != '\0') && (*(char *)(lVar14 + uVar10) == '\0'))
                  {
                    uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                    goto LAB_00194de8;
                  }
                  goto LAB_00193f09;
                }
                goto LAB_00193ec9;
              }
              goto LAB_00193ed1;
            }
LAB_00193c7d:
            *(undefined4 *)(lVar20 + uVar12 * 4) = 0;
          }
          else if (uVar12 == 0) {
LAB_00193b46:
            uVar10 = uVar12 | 1;
            if ((uVar15 != 0) && (((long)uVar10 < lVar6 && (*(char *)(lVar18 + uVar10) != '\0')))) {
              if ((*(char *)(lVar18 + uVar12) == '\0') &&
                 (((uVar12 != 0 && (*(char *)(lVar18 + -1 + uVar12) != '\0')) &&
                  (*(char *)(lVar14 + uVar12) == '\0')))) {
                uVar9 = *(uint *)(lVar13 + -8 + uVar12 * 4);
                do {
                  uVar8 = uVar9;
                  uVar10 = (ulong)uVar8;
                  uVar9 = UF::P_[uVar10];
                  uVar7 = *(uint *)(lVar13 + uVar12 * 4);
                } while (UF::P_[uVar10] < uVar8);
                do {
                  uVar9 = uVar7;
                  uVar21 = (ulong)uVar9;
                  uVar7 = UF::P_[uVar21];
                } while (UF::P_[uVar21] < uVar9);
                goto LAB_00194de8;
              }
              goto LAB_00193ec9;
            }
            if (((long)uVar10 < lVar6) && (*(char *)(lVar17 + uVar10) != '\0')) {
              if ((uVar15 == 0) || (lVar6 <= (long)(uVar12 + 2))) {
                if (uVar15 == 0) goto LAB_00193ed1;
              }
              else if (*(char *)(lVar18 + uVar12 + 2) != '\0') {
                if (*(char *)(lVar18 + uVar12) == '\0') {
                  if ((uVar12 != 0) && (*(char *)(lVar18 + -1 + uVar12) != '\0')) {
                    if (*(char *)(lVar14 + uVar10) == '\0') {
                      uVar9 = *(uint *)(lVar13 + -8 + uVar12 * 4);
                      do {
                        uVar8 = uVar9;
                        uVar10 = (ulong)uVar8;
                        uVar9 = UF::P_[uVar10];
                        uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                      } while (UF::P_[uVar10] < uVar8);
                      do {
                        uVar9 = uVar7;
                        uVar21 = (ulong)uVar9;
                        uVar7 = UF::P_[uVar21];
                      } while (UF::P_[uVar21] < uVar9);
                    }
                    else {
                      if (*(char *)(lVar14 + uVar12) != '\0') goto LAB_00193f09;
                      uVar9 = *(uint *)(lVar13 + -8 + uVar12 * 4);
                      do {
                        uVar8 = uVar9;
                        uVar10 = (ulong)uVar8;
                        uVar9 = UF::P_[uVar10];
                        uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                      } while (UF::P_[uVar10] < uVar8);
                      do {
                        uVar9 = uVar7;
                        uVar21 = (ulong)uVar9;
                        uVar7 = UF::P_[uVar21];
                      } while (UF::P_[uVar21] < uVar9);
                    }
LAB_00194de8:
                    if (uVar8 < uVar9) goto LAB_00194dec;
                    UF::P_[uVar10] = uVar9;
                    goto LAB_00194df7;
                  }
                }
                else if (*(char *)(lVar14 + uVar10) == '\0') {
                  uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar10 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar10];
                    uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                  } while (UF::P_[uVar10] < uVar8);
                  do {
                    uVar9 = uVar7;
                    uVar21 = (ulong)uVar9;
                    uVar7 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar9);
                  goto LAB_00194de8;
                }
LAB_00193f09:
                uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                goto LAB_00194b45;
              }
              if (*(char *)(lVar18 + uVar12) != '\0') goto LAB_00193ec9;
              if (uVar15 != 0 && uVar12 != 0) goto LAB_00193cb4;
            }
            else if (uVar15 != 0) {
              if (*(char *)(lVar18 + uVar12) != '\0') goto LAB_00193ec9;
              if (uVar12 == 0) goto LAB_00193ed1;
LAB_00193cb4:
              lVar11 = lVar13 + -8;
              if (*(char *)(lVar18 + -1 + uVar12) != '\0') goto LAB_00193ec9;
            }
LAB_00193ed1:
            UF::P_[UF::length_] = UF::length_;
            uVar9 = UF::length_ + 1;
            *(uint *)(lVar20 + uVar12 * 4) = UF::length_;
            UF::length_ = uVar9;
          }
          else {
            if (*(char *)(lVar17 + -1 + uVar12) != '\0') {
              uVar10 = uVar12 | 1;
              if (((uVar15 == 0) || (lVar6 <= (long)uVar10)) || (*(char *)(lVar18 + uVar10) == '\0')
                 ) {
                if ((((long)uVar10 < lVar6) && (*(char *)(lVar17 + uVar10) != '\0')) &&
                   ((uVar15 != 0 &&
                    (((long)(uVar12 + 2) < lVar6 && (*(char *)(lVar18 + uVar12 + 2) != '\0')))))) {
                  if (*(char *)(lVar14 + uVar10) == '\0') {
                    uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                  else {
                    if (*(char *)(lVar18 + uVar12) != '\0') goto LAB_00194b40;
                    if (*(char *)(lVar14 + uVar12) == '\0') {
                      uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                      do {
                        uVar8 = uVar9;
                        uVar10 = (ulong)uVar8;
                        uVar9 = UF::P_[uVar10];
                        uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                      } while (UF::P_[uVar10] < uVar8);
                      do {
                        uVar9 = uVar7;
                        uVar21 = (ulong)uVar9;
                        uVar7 = UF::P_[uVar21];
                      } while (UF::P_[uVar21] < uVar9);
                    }
                    else {
                      if (*(char *)(lVar18 + -1 + uVar12) != '\0') goto LAB_00194b40;
                      if (*(char *)((uVar12 - 2) + lVar18) == '\0') {
                        uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar10 = (ulong)uVar8;
                          uVar9 = UF::P_[uVar10];
                          uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                        } while (UF::P_[uVar10] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar21 = (ulong)uVar9;
                          uVar7 = UF::P_[uVar21];
                        } while (UF::P_[uVar21] < uVar9);
                      }
                      else {
                        if (*(char *)(lVar14 + -1 + uVar12) != '\0') goto LAB_00194b40;
                        uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar10 = (ulong)uVar8;
                          uVar9 = UF::P_[uVar10];
                          uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                        } while (UF::P_[uVar10] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar21 = (ulong)uVar9;
                          uVar7 = UF::P_[uVar21];
                        } while (UF::P_[uVar21] < uVar9);
                      }
                    }
                  }
                  goto LAB_00194708;
                }
              }
              else if (*(char *)(lVar18 + uVar12) == '\0') {
                if (*(char *)(lVar14 + uVar12) == '\0') {
                  uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar10 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar10];
                    uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                  } while (UF::P_[uVar10] < uVar8);
                  do {
                    uVar9 = uVar7;
                    uVar21 = (ulong)uVar9;
                    uVar7 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar9);
                }
                else {
                  if (*(char *)(lVar18 + -1 + uVar12) != '\0') goto LAB_00194b40;
                  if (*(char *)((uVar12 - 2) + lVar18) == '\0') {
                    uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                  else {
                    if (*(char *)(lVar14 + -1 + uVar12) != '\0') goto LAB_00194b40;
                    uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                }
                goto LAB_00194708;
              }
              goto LAB_00194b40;
            }
            if ((uVar5 <= uVar19) || (*(char *)(lVar16 + -1 + uVar12) == '\0')) goto LAB_00193b46;
            uVar10 = uVar12 | 1;
            if (((uVar15 != 0) && ((long)uVar10 < lVar6)) && (*(char *)(lVar18 + uVar10) != '\0')) {
              if (*(char *)((uVar12 - 2) + lVar17) == '\0') {
                if (*(char *)(lVar18 + uVar12) == '\0') {
                  if (*(char *)(lVar18 + -1 + uVar12) == '\0') {
                    uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                    goto LAB_00194de8;
                  }
                  if (*(char *)(lVar14 + uVar12) == '\0') {
                    uVar9 = *(uint *)(lVar13 + -8 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar9 = UF::P_[uVar8];
                      uVar7 = *(uint *)(lVar13 + uVar12 * 4);
                    } while (UF::P_[uVar8] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar7 = UF::P_[uVar9];
                    } while (UF::P_[uVar9] < uVar9);
                    if (uVar8 < uVar9) {
                      UF::P_[uVar9] = uVar8;
                      uVar9 = uVar8;
                    }
                    else {
                      UF::P_[uVar8] = uVar9;
                    }
                    do {
                      uVar7 = uVar9;
                      uVar10 = (ulong)uVar7;
                      uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                      uVar9 = puVar4[uVar10];
                    } while (puVar4[uVar10] < uVar7);
                    do {
                      uVar9 = uVar8;
                      uVar21 = (ulong)uVar9;
                      uVar8 = puVar4[uVar21];
                    } while (puVar4[uVar21] < uVar9);
                    goto LAB_00194d99;
                  }
                  uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                  do {
                    uVar7 = uVar9;
                    uVar9 = UF::P_[uVar7];
                    uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                  } while (UF::P_[uVar7] < uVar7);
                  do {
                    uVar9 = uVar8;
                    uVar21 = (ulong)uVar9;
                    uVar8 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar9);
                  if (uVar7 < uVar9) {
LAB_0019437c:
                    uVar9 = uVar7;
                    UF::P_[uVar21] = uVar9;
                  }
                  else {
                    UF::P_[uVar7] = uVar9;
                  }
                  goto LAB_00194b45;
                }
                uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                do {
                  uVar8 = uVar9;
                  uVar10 = (ulong)uVar8;
                  uVar9 = UF::P_[uVar10];
                  uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                } while (UF::P_[uVar10] < uVar8);
                do {
                  uVar9 = uVar7;
                  uVar21 = (ulong)uVar9;
                  uVar7 = UF::P_[uVar21];
                } while (UF::P_[uVar21] < uVar9);
              }
              else if (*(char *)(lVar18 + -1 + uVar12) == '\0') {
                if (*(char *)(lVar18 + -2 + uVar12) == '\0') {
                  uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar10 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar10];
                    uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                  } while (UF::P_[uVar10] < uVar8);
                  do {
                    uVar9 = uVar7;
                    uVar21 = (ulong)uVar9;
                    uVar7 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar9);
                }
                else if (*(char *)(lVar14 + -1 + uVar12) == '\0') {
                  uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar10 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar10];
                    uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                  } while (UF::P_[uVar10] < uVar8);
                  do {
                    uVar9 = uVar7;
                    uVar21 = (ulong)uVar9;
                    uVar7 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar9);
                }
                else {
                  if ((*(char *)(lVar18 + uVar12) != '\0') || (*(char *)(lVar14 + uVar12) != '\0'))
                  goto LAB_00194b40;
                  uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar10 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar10];
                    uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                  } while (UF::P_[uVar10] < uVar8);
                  do {
                    uVar9 = uVar7;
                    uVar21 = (ulong)uVar9;
                    uVar7 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar9);
                }
              }
              else {
                if ((*(char *)(lVar18 + uVar12) != '\0') || (*(char *)(lVar14 + uVar12) != '\0'))
                goto LAB_00194b40;
                uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                do {
                  uVar8 = uVar9;
                  uVar10 = (ulong)uVar8;
                  uVar9 = UF::P_[uVar10];
                  uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                } while (UF::P_[uVar10] < uVar8);
                do {
                  uVar9 = uVar7;
                  uVar21 = (ulong)uVar9;
                  uVar7 = UF::P_[uVar21];
                } while (UF::P_[uVar21] < uVar9);
              }
LAB_00194708:
              if (uVar8 < uVar9) {
LAB_00194dec:
                uVar9 = uVar8;
                UF::P_[uVar21] = uVar9;
              }
              else {
                UF::P_[uVar10] = uVar9;
              }
LAB_00194df7:
              *(uint *)(lVar20 + uVar12 * 4) = uVar9;
              goto LAB_00194b49;
            }
            if (((long)uVar10 < lVar6) && (*(char *)(lVar17 + uVar10) != '\0')) {
              if (((uVar15 == 0) || (lVar6 <= (long)(uVar12 + 2))) ||
                 (*(char *)(lVar18 + uVar12 + 2) == '\0')) {
                if (uVar15 != 0) {
                  if (*(char *)(lVar18 + -1 + uVar12) == '\0') {
                    if (*(char *)(lVar18 + uVar12) != '\0') {
                      if (*(char *)((uVar12 - 2) + lVar17) == '\0') {
                        uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar10 = (ulong)uVar8;
                          uVar9 = UF::P_[uVar10];
                          uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                        } while (UF::P_[uVar10] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar21 = (ulong)uVar9;
                          uVar7 = UF::P_[uVar21];
                        } while (UF::P_[uVar21] < uVar9);
                      }
                      else if (*(char *)(lVar18 + -2 + uVar12) == '\0') {
                        uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar10 = (ulong)uVar8;
                          uVar9 = UF::P_[uVar10];
                          uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                        } while (UF::P_[uVar10] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar21 = (ulong)uVar9;
                          uVar7 = UF::P_[uVar21];
                        } while (UF::P_[uVar21] < uVar9);
                      }
                      else {
                        if (*(char *)(lVar14 + -1 + uVar12) != '\0') goto LAB_00194b40;
                        uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar10 = (ulong)uVar8;
                          uVar9 = UF::P_[uVar10];
                          uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                        } while (UF::P_[uVar10] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar21 = (ulong)uVar9;
                          uVar7 = UF::P_[uVar21];
                        } while (UF::P_[uVar21] < uVar9);
                      }
                      goto LAB_00194de8;
                    }
                  }
                  else if (*(char *)((uVar12 - 2) + lVar17) == '\0') {
                    uVar9 = *(uint *)(lVar13 + -8 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                    goto LAB_00194de8;
                  }
                }
                goto LAB_00194b40;
              }
              if (*(char *)((uVar12 - 2) + lVar17) != '\0') {
                if (*(char *)(lVar18 + -1 + uVar12) == '\0') {
                  if (*(char *)(lVar14 + uVar10) == '\0') {
                    if (*(char *)(lVar18 + uVar12) != '\0') {
                      if (*(char *)(lVar18 + -2 + uVar12) == '\0') {
                        uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar9 = UF::P_[uVar8];
                          uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                        } while (UF::P_[uVar8] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                        if (uVar8 < uVar9) {
                          UF::P_[uVar9] = uVar8;
                          uVar9 = uVar8;
                        }
                        else {
                          UF::P_[uVar8] = uVar9;
                        }
                        do {
                          uVar7 = uVar9;
                          uVar10 = (ulong)uVar7;
                          uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          uVar9 = puVar4[uVar10];
                        } while (puVar4[uVar10] < uVar7);
                        do {
                          uVar9 = uVar8;
                          uVar21 = (ulong)uVar9;
                          uVar8 = puVar4[uVar21];
                        } while (puVar4[uVar21] < uVar9);
                      }
                      else {
                        if (*(char *)(lVar14 + -1 + uVar12) != '\0') {
                          uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                          do {
                            uVar7 = uVar9;
                            uVar10 = (ulong)uVar7;
                            uVar9 = UF::P_[uVar10];
                            uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          } while (UF::P_[uVar10] < uVar7);
                          do {
                            uVar9 = uVar8;
                            uVar21 = (ulong)uVar9;
                            uVar8 = UF::P_[uVar21];
                          } while (UF::P_[uVar21] < uVar9);
                          goto LAB_00194374;
                        }
                        uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                        do {
                          uVar8 = uVar9;
                          uVar9 = UF::P_[uVar8];
                          uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                        } while (UF::P_[uVar8] < uVar8);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                        if (uVar8 < uVar9) {
                          UF::P_[uVar9] = uVar8;
                          uVar9 = uVar8;
                        }
                        else {
                          UF::P_[uVar8] = uVar9;
                        }
                        do {
                          uVar7 = uVar9;
                          uVar10 = (ulong)uVar7;
                          uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                          uVar9 = puVar4[uVar10];
                        } while (puVar4[uVar10] < uVar7);
                        do {
                          uVar9 = uVar8;
                          uVar21 = (ulong)uVar9;
                          uVar8 = puVar4[uVar21];
                        } while (puVar4[uVar21] < uVar9);
                      }
                      goto LAB_00194d99;
                    }
                    uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                  else if (*(char *)(lVar18 + -2 + uVar12) == '\0') {
                    uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                  else if (*(char *)(lVar14 + -1 + uVar12) == '\0') {
                    uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                  else {
                    if ((*(char *)(lVar18 + uVar12) != '\0') || (*(char *)(lVar14 + uVar12) != '\0')
                       ) goto LAB_00194b40;
                    uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                }
                else if (*(char *)(lVar14 + uVar10) == '\0') {
                  uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar10 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar10];
                    uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                  } while (UF::P_[uVar10] < uVar8);
                  do {
                    uVar9 = uVar7;
                    uVar21 = (ulong)uVar9;
                    uVar7 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar9);
                }
                else {
                  if ((*(char *)(lVar18 + uVar12) != '\0') || (*(char *)(lVar14 + uVar12) != '\0'))
                  goto LAB_00194b40;
                  uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar10 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar10];
                    uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                  } while (UF::P_[uVar10] < uVar8);
                  do {
                    uVar9 = uVar7;
                    uVar21 = (ulong)uVar9;
                    uVar7 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar9);
                }
                goto LAB_00194de8;
              }
              if (*(char *)(lVar18 + uVar12) == '\0') {
                if (*(char *)(lVar18 + -1 + uVar12) == '\0') {
                  uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar10 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar10];
                    uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                  } while (UF::P_[uVar10] < uVar8);
                  do {
                    uVar9 = uVar7;
                    uVar21 = (ulong)uVar9;
                    uVar7 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar9);
                  goto LAB_00194de8;
                }
                if (*(char *)(lVar14 + uVar10) == '\0') {
                  uVar9 = *(uint *)(lVar13 + -8 + uVar12 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar9 = UF::P_[uVar8];
                    uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                  } while (UF::P_[uVar8] < uVar8);
                  do {
                    uVar9 = uVar7;
                    uVar7 = UF::P_[uVar9];
                  } while (UF::P_[uVar9] < uVar9);
                  if (uVar8 < uVar9) {
                    UF::P_[uVar9] = uVar8;
                    uVar9 = uVar8;
                  }
                  else {
                    UF::P_[uVar8] = uVar9;
                  }
                  do {
                    uVar7 = uVar9;
                    uVar10 = (ulong)uVar7;
                    uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    uVar9 = puVar4[uVar10];
                  } while (puVar4[uVar10] < uVar7);
                  do {
                    uVar9 = uVar8;
                    uVar21 = (ulong)uVar9;
                    uVar8 = puVar4[uVar21];
                  } while (puVar4[uVar21] < uVar9);
                }
                else {
                  if (*(char *)(lVar14 + uVar12) != '\0') {
                    uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                    do {
                      uVar7 = uVar9;
                      uVar10 = (ulong)uVar7;
                      uVar9 = UF::P_[uVar10];
                      uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar7);
                    do {
                      uVar9 = uVar8;
                      uVar21 = (ulong)uVar9;
                      uVar8 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                    goto LAB_00194374;
                  }
                  uVar9 = *(uint *)(lVar13 + -8 + uVar12 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar9 = UF::P_[uVar8];
                    uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                  } while (UF::P_[uVar8] < uVar8);
                  do {
                    uVar9 = uVar7;
                    uVar7 = UF::P_[uVar9];
                  } while (UF::P_[uVar9] < uVar9);
                  if (uVar8 < uVar9) {
                    UF::P_[uVar9] = uVar8;
                    uVar9 = uVar8;
                  }
                  else {
                    UF::P_[uVar8] = uVar9;
                  }
                  do {
                    uVar7 = uVar9;
                    uVar10 = (ulong)uVar7;
                    uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    uVar9 = puVar4[uVar10];
                  } while (puVar4[uVar10] < uVar7);
                  do {
                    uVar9 = uVar8;
                    uVar21 = (ulong)uVar9;
                    uVar8 = puVar4[uVar21];
                  } while (puVar4[uVar21] < uVar9);
                }
              }
              else {
                if (*(char *)(lVar14 + uVar10) != '\0') {
                  uVar9 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                  do {
                    uVar7 = uVar9;
                    uVar10 = (ulong)uVar7;
                    uVar9 = UF::P_[uVar10];
                    uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                  } while (UF::P_[uVar10] < uVar7);
                  do {
                    uVar9 = uVar8;
                    uVar21 = (ulong)uVar9;
                    uVar8 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar9);
LAB_00194374:
                  if (uVar7 < uVar9) goto LAB_0019437c;
                  UF::P_[uVar10] = uVar9;
                  goto LAB_00194b45;
                }
                uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                do {
                  uVar8 = uVar9;
                  uVar9 = UF::P_[uVar8];
                  uVar7 = *(uint *)(lVar13 + 8 + uVar12 * 4);
                } while (UF::P_[uVar8] < uVar8);
                do {
                  uVar9 = uVar7;
                  uVar7 = UF::P_[uVar9];
                } while (UF::P_[uVar9] < uVar9);
                if (uVar8 < uVar9) {
                  UF::P_[uVar9] = uVar8;
                  uVar9 = uVar8;
                }
                else {
                  UF::P_[uVar8] = uVar9;
                }
                do {
                  uVar7 = uVar9;
                  uVar10 = (ulong)uVar7;
                  uVar8 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                  uVar9 = puVar4[uVar10];
                } while (puVar4[uVar10] < uVar7);
                do {
                  uVar9 = uVar8;
                  uVar21 = (ulong)uVar9;
                  uVar8 = puVar4[uVar21];
                } while (puVar4[uVar21] < uVar9);
              }
LAB_00194d99:
              if (uVar7 < uVar9) {
                puVar4[uVar21] = uVar7;
                uVar9 = uVar7;
              }
              else {
                puVar4[uVar10] = uVar9;
              }
              *(uint *)(lVar20 + uVar12 * 4) = uVar9;
              goto LAB_00194b49;
            }
            if (uVar15 != 0) {
              if (*(char *)(lVar18 + -1 + uVar12) == '\0') {
                if (*(char *)(lVar18 + uVar12) != '\0') {
                  if (*(char *)((uVar12 - 2) + lVar17) == '\0') {
                    uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                  else if (*(char *)(lVar18 + -2 + uVar12) == '\0') {
                    uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                  else {
                    if (*(char *)(lVar14 + -1 + uVar12) != '\0') goto LAB_00194b40;
                    uVar9 = *(uint *)(lVar13 + uVar12 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar10 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar10];
                      uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                    } while (UF::P_[uVar10] < uVar8);
                    do {
                      uVar9 = uVar7;
                      uVar21 = (ulong)uVar9;
                      uVar7 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar9);
                  }
                  goto LAB_00194de8;
                }
              }
              else if (*(char *)((uVar12 - 2) + lVar17) == '\0') {
                uVar9 = *(uint *)(lVar13 + -8 + uVar12 * 4);
                do {
                  uVar8 = uVar9;
                  uVar10 = (ulong)uVar8;
                  uVar9 = UF::P_[uVar10];
                  uVar7 = *(uint *)(lVar20 + -8 + uVar12 * 4);
                } while (UF::P_[uVar10] < uVar8);
                do {
                  uVar9 = uVar7;
                  uVar21 = (ulong)uVar9;
                  uVar7 = UF::P_[uVar21];
                } while (UF::P_[uVar21] < uVar9);
                goto LAB_00194de8;
              }
            }
LAB_00194b40:
            uVar9 = *(uint *)(lVar20 + -8 + uVar12 * 4);
LAB_00194b45:
            *(uint *)(lVar20 + uVar12 * 4) = uVar9;
          }
LAB_00194b49:
          uVar12 = uVar12 + 2;
        } while ((long)uVar12 < lVar6);
      }
      uVar15 = uVar15 + 2;
    } while (uVar15 < uVar5);
  }
  return;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }